

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action_Response_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Action_Response_PDU::Action_Response_PDU
          (Action_Response_PDU *this,Action_Request_PDU *pdu,RequestStatus RS)

{
  pointer pKVar1;
  Comment_PDU *pCVar2;
  KUINT8 KVar3;
  KUINT16 KVar4;
  ProtocolVersion PVar5;
  KUINT32 KVar6;
  EntityIdentifier *pEVar7;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  *__x;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  *__x_00;
  
  Data_PDU::Data_PDU(&this->super_Data_PDU);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6._vptr_Header6 = (_func_int **)&PTR__Action_Response_PDU_00222378;
  this->m_ui32RequestStatus = RS;
  PVar5 = Header6::GetProtocolVersion((Header6 *)pdu);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui8ProtocolVersion = (KUINT8)PVar5;
  KVar3 = Header6::GetExerciseID((Header6 *)pdu);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui8ExerciseID = KVar3;
  pCVar2 = &(this->super_Data_PDU).super_Comment_PDU;
  (pCVar2->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '\x11';
  (pCVar2->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily =
       '\x05';
  KVar6 = Data_PDU::GetRequestID(&pdu->super_Data_PDU);
  (this->super_Data_PDU).m_ui32RequestID = KVar6;
  pEVar7 = Simulation_Management_Header::GetOriginatingEntityID((Simulation_Management_Header *)pdu)
  ;
  KVar4 = (pEVar7->super_SimulationIdentifier).m_ui16ApplicationID;
  pCVar2 = &(this->super_Data_PDU).super_Comment_PDU;
  (pCVar2->super_Simulation_Management_Header).m_ReceivingEntityID.super_SimulationIdentifier.
  m_ui16SiteID = (pEVar7->super_SimulationIdentifier).m_ui16SiteID;
  (pCVar2->super_Simulation_Management_Header).m_ReceivingEntityID.super_SimulationIdentifier.
  m_ui16ApplicationID = KVar4;
  *(undefined2 *)
   &(this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.m_ReceivingEntityID.
    super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(pEVar7->super_SimulationIdentifier).field_0xc;
  pEVar7 = Simulation_Management_Header::GetReceivingEntityID((Simulation_Management_Header *)pdu);
  KVar4 = (pEVar7->super_SimulationIdentifier).m_ui16ApplicationID;
  pCVar2 = &(this->super_Data_PDU).super_Comment_PDU;
  (pCVar2->super_Simulation_Management_Header).m_OriginatingEntityID.super_SimulationIdentifier.
  m_ui16SiteID = (pEVar7->super_SimulationIdentifier).m_ui16SiteID;
  (pCVar2->super_Simulation_Management_Header).m_OriginatingEntityID.super_SimulationIdentifier.
  m_ui16ApplicationID = KVar4;
  *(undefined2 *)
   &(this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.
    m_OriginatingEntityID.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(pEVar7->super_SimulationIdentifier).field_0xc;
  __x = Comment_PDU::GetVariableDatum((Comment_PDU *)pdu);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::operator=(&(this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum,__x);
  __x_00 = Comment_PDU::GetFixedDatum((Comment_PDU *)pdu);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  ::operator=(&(this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum,__x_00);
  pKVar1 = (this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_Data_PDU).super_Comment_PDU.m_ui32NumFixedDatum =
       (int)((ulong)((long)(this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum.
                           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum.
                          super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  (this->super_Data_PDU).super_Comment_PDU.m_ui32NumVariableDatum =
       (int)((ulong)((long)pKVar1 -
                    (long)(this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum.
                          super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  KVar4 = Header6::GetPDULength((Header6 *)pdu);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui16PDULength = KVar4;
  return;
}

Assistant:

Action_Response_PDU::Action_Response_PDU( const Action_Request_PDU & pdu, RequestStatus RS ) :
    m_ui32RequestStatus( RS )
{
    m_ui8ProtocolVersion = pdu.GetProtocolVersion();
    m_ui8ExerciseID = pdu.GetExerciseID();
    m_ui8PDUType = Action_Response_PDU_Type;
    m_ui8ProtocolFamily = Simulation_Management;
    m_ui32RequestID = pdu.GetRequestID();
    m_ReceivingEntityID = pdu.GetOriginatingEntityID();
    m_OriginatingEntityID = pdu.GetReceivingEntityID();
    m_vVariableDatum = pdu.GetVariableDatum();
    m_vFixedDatum = pdu.GetFixedDatum();
    m_ui32NumFixedDatum = m_vFixedDatum.size();
    m_ui32NumVariableDatum = m_vVariableDatum.size();

    // Calculate the size
    m_ui16PDULength = pdu.GetPDULength() - Action_Request_PDU::ACTION_REQUEST_PDU_SIZE + ACTION_RESPONSE_PDU_SIZE;
}